

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O3

int * Wln_RetHeadToTail(Wln_Ret_t *p,int *pHead)

{
  uint *puVar1;
  uint uVar2;
  
  uVar2 = *pHead;
  while( true ) {
    if (uVar2 == 0) {
      __assert_fail("pHead[0]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnRetime.c"
                    ,0x15e,"int *Wln_RetHeadToTail(Wln_Ret_t *, int *)");
    }
    if (((int)uVar2 < 0) || ((p->vEdgeLinks).nSize <= (int)uVar2)) break;
    puVar1 = (uint *)pHead;
    pHead = (p->vEdgeLinks).pArray + uVar2;
    uVar2 = *pHead;
    if (uVar2 == 0) {
      return (int *)puVar1;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

int * Wln_RetHeadToTail( Wln_Ret_t * p, int * pHead )
{
    int * pLink;
    assert( pHead[0] );
    pLink = Vec_IntEntryP( &p->vEdgeLinks, pHead[0] );
    if ( pLink[0] == 0 )
        return pHead;
    return Wln_RetHeadToTail( p, pLink );
}